

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O0

void __thiscall
spdlog::details::registry_t<std::mutex>::throw_if_exists
          (registry_t<std::mutex> *this,string *logger_name)

{
  bool bVar1;
  spdlog_ex *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_true>
  local_20;
  string *local_18;
  string *logger_name_local;
  registry_t<std::mutex> *this_local;
  
  local_18 = logger_name;
  logger_name_local = (string *)this;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
       ::find(&this->_loggers,logger_name);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
       ::end(&this->_loggers);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (!bVar1) {
    return;
  }
  this_00 = (spdlog_ex *)__cxa_allocate_exception(0x28);
  std::operator+(&local_68,"logger with name \'",local_18);
  std::operator+(&local_48,&local_68,"\' already exists");
  spdlog_ex::spdlog_ex(this_00,&local_48);
  __cxa_throw(this_00,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

void throw_if_exists(const std::string &logger_name)
    {
        if (_loggers.find(logger_name) != _loggers.end())
        {
            throw spdlog_ex("logger with name '" + logger_name + "' already exists");
        }
    }